

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineFramebufferAttachmentTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::pipeline::anon_unknown_0::makeRenderPass
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkFormat colorFormat,deUint32 numLayers,bool multisample)

{
  allocator<vk::VkAttachmentReference> *this;
  value_type vVar1;
  deUint32 dVar2;
  reference __dest;
  reference pvVar3;
  size_type sVar4;
  ulong __n;
  undefined1 local_158 [8];
  VkRenderPassCreateInfo renderPassInfo;
  VkSubpassDescription subpassDescription;
  VkAttachmentReference attachmentRef;
  deUint32 i_1;
  VkAttachmentDescription colorAttachmentDescription;
  deUint32 i;
  vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> subpasses;
  undefined1 local_78 [8];
  vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
  colorAttachmentReferences;
  deUint32 attachmentIndex;
  allocator<vk::VkAttachmentDescription> local_49;
  undefined1 local_48 [8];
  vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
  attachmentDescriptions;
  bool multisample_local;
  deUint32 numLayers_local;
  VkFormat colorFormat_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  attachmentDescriptions.
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = multisample;
  std::allocator<vk::VkAttachmentDescription>::allocator(&local_49);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::vector
            ((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> *)
             local_48,(ulong)numLayers,&local_49);
  std::allocator<vk::VkAttachmentDescription>::~allocator(&local_49);
  colorAttachmentReferences.
  super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  this = (allocator<vk::VkAttachmentReference> *)
         ((long)&subpasses.
                 super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<vk::VkAttachmentReference>::allocator(this);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::vector
            ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
             local_78,(ulong)numLayers,this);
  std::allocator<vk::VkAttachmentReference>::~allocator
            ((allocator<vk::VkAttachmentReference> *)
             ((long)&subpasses.
                     super__Vector_base<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::vector
            ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
             &colorAttachmentDescription.finalLayout);
  for (colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      colorAttachmentDescription.initialLayout < numLayers;
      colorAttachmentDescription.initialLayout =
           colorAttachmentDescription.initialLayout + VK_IMAGE_LAYOUT_GENERAL) {
    attachmentRef.layout = VK_IMAGE_LAYOUT_UNDEFINED;
    colorAttachmentDescription.flags = 4;
    if (((attachmentDescriptions.
          super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ^ 0xff) & 1) != 0) {
      colorAttachmentDescription.flags = 1;
    }
    colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
    colorAttachmentDescription.samples = 0;
    colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
    colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
    colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
    colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_LAST;
    __n = (ulong)(uint)colorAttachmentReferences.
                       super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    colorAttachmentReferences.
    super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)colorAttachmentReferences.
               super__Vector_base<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
    __dest = std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
             ::operator[]((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                           *)local_48,__n);
    memcpy(__dest,&attachmentRef.layout,0x24);
  }
  for (attachmentRef.attachment = 0; dVar2 = attachmentRef.attachment,
      attachmentRef.attachment < numLayers; attachmentRef.attachment = attachmentRef.attachment + 1)
  {
    pvVar3 = std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::
             operator[]((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>
                         *)local_78,(ulong)attachmentRef.attachment);
    vVar1.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
    vVar1.attachment = dVar2;
    *pvVar3 = vVar1;
    renderPassInfo.pDependencies = (VkSubpassDependency *)0x0;
    std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::operator[]
              ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
               local_78,(ulong)attachmentRef.attachment);
    std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::push_back
              ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
               &colorAttachmentDescription.finalLayout,(value_type *)&renderPassInfo.pDependencies);
  }
  local_158._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassInfo._4_4_ = 0;
  renderPassInfo.pNext._0_4_ = 0;
  renderPassInfo.pNext._4_4_ = numLayers;
  renderPassInfo._16_8_ =
       std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
       operator[]((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                   *)local_48,0);
  sVar4 = std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::size
                    ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
                     &colorAttachmentDescription.finalLayout);
  renderPassInfo.pAttachments._0_4_ = (undefined4)sVar4;
  renderPassInfo._32_8_ =
       std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::operator[]
                 ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
                  &colorAttachmentDescription.finalLayout,0);
  renderPassInfo.pSubpasses._0_4_ = 0;
  renderPassInfo.dependencyCount = 0;
  renderPassInfo._52_4_ = 0;
  ::vk::createRenderPass
            (__return_storage_ptr__,vk,device,(VkRenderPassCreateInfo *)local_158,
             (VkAllocationCallbacks *)0x0);
  std::vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_>::~vector
            ((vector<vk::VkSubpassDescription,_std::allocator<vk::VkSubpassDescription>_> *)
             &colorAttachmentDescription.finalLayout);
  std::vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_>::~vector
            ((vector<vk::VkAttachmentReference,_std::allocator<vk::VkAttachmentReference>_> *)
             local_78);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::~vector
            ((vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_> *)
             local_48);
  return __return_storage_ptr__;
}

Assistant:

Move<VkRenderPass> makeRenderPass (const DeviceInterface& vk,
								   const VkDevice		  device,
								   const VkFormat		  colorFormat,
								   const deUint32		  numLayers,
								   const bool			  multisample)
{
	vector<VkAttachmentDescription>	attachmentDescriptions		(numLayers);
	deUint32						attachmentIndex				= 0;
	vector<VkAttachmentReference>	colorAttachmentReferences	(numLayers);
	vector<VkSubpassDescription>	subpasses;

	for (deUint32 i = 0; i < numLayers; i++)
	{
		VkAttachmentDescription colorAttachmentDescription =
		{
			(VkAttachmentDescriptionFlags)0,								// VkAttachmentDescriptionFla	flags;
			colorFormat,													// VkFormat						format;
			!multisample ? VK_SAMPLE_COUNT_1_BIT : VK_SAMPLE_COUNT_4_BIT,	// VkSampleCountFlagBits		samples;
			VK_ATTACHMENT_LOAD_OP_LOAD,										// VkAttachmentLoadOp			loadOp;
			VK_ATTACHMENT_STORE_OP_STORE,									// VkAttachmentStoreOp			storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,								// VkAttachmentLoadOp			stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,								// VkAttachmentStoreOp			stencilStoreOp;
			VK_IMAGE_LAYOUT_GENERAL,										// VkImageLayout				initialLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,						// VkImageLayout				finalLayout;
		};
		attachmentDescriptions[attachmentIndex++] = colorAttachmentDescription;
	}

	// Create a subpass for each attachment (each attachment is a layer of an arrayed image).
	for (deUint32 i = 0; i < numLayers; ++i)
	{
		const VkAttachmentReference attachmentRef =
		{
			i,											// deUint32			attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL	// VkImageLayout	layout;
		};
		colorAttachmentReferences[i] = attachmentRef;

		const VkSubpassDescription subpassDescription =
		{
			(VkSubpassDescriptionFlags)0,		// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,	// VkPipelineBindPoint				pipelineBindPoint;
			0u,									// deUint32							inputAttachmentCount;
			DE_NULL,							// const VkAttachmentReference*		pInputAttachments;
			1u,									// deUint32							colorAttachmentCount;
			&colorAttachmentReferences[i],		// const VkAttachmentReference*		pColorAttachments;
			DE_NULL,							// const VkAttachmentReference*		pResolveAttachments;
			DE_NULL,							// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,									// deUint32							preserveAttachmentCount;
			DE_NULL								// const deUint32*					pPreserveAttachments;
		};
		subpasses.push_back(subpassDescription);
	}

	const VkRenderPassCreateInfo renderPassInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,	// VkStructureType					sType;
		DE_NULL,									// const void*						pNext;
		(VkRenderPassCreateFlags)0,					// VkRenderPassCreateFlags			flags;
		numLayers,									// deUint32							attachmentCount;
		&attachmentDescriptions[0],					// const VkAttachmentDescription*	pAttachments;
		static_cast<deUint32>(subpasses.size()),	// deUint32							subpassCount;
		&subpasses[0],								// const VkSubpassDescription*		pSubpasses;
		0u,											// deUint32							dependencyCount;
		DE_NULL										// const VkSubpassDependency*		pDependencies;
	};

	return createRenderPass(vk, device, &renderPassInfo);
}